

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_container_is_subset(bitset_container_t *container1,bitset_container_t *container2)

{
  ulong *puVar1;
  ulong *puVar2;
  long lVar3;
  bool bVar4;
  
  if ((container1->cardinality != -1) &&
     (container2->cardinality != -1 && container2->cardinality < container1->cardinality)) {
    return false;
  }
  lVar3 = 0;
  do {
    bVar4 = lVar3 == 0x400;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = container2->words + lVar3;
    puVar2 = container1->words + lVar3;
    lVar3 = lVar3 + 1;
  } while ((*puVar2 & ~*puVar1) == 0);
  return bVar4;
}

Assistant:

bool bitset_container_is_subset(const bitset_container_t *container1,
                          const bitset_container_t *container2) {
    if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
        if(container1->cardinality > container2->cardinality) {
            return false;
        }
    }
    for(int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
		if((container1->words[i] & container2->words[i]) != container1->words[i]) {
			return false;
		}
	}
	return true;
}